

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointConnection::~IfcStructuralPointConnection
          (IfcStructuralPointConnection *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&this->super_IfcStructuralConnection + -0x18);
  puVar1 = (undefined8 *)(&(this->super_IfcStructuralConnection).field_0x0 + lVar3);
  pvVar2 = &(this->super_IfcStructuralConnection).field_0xb8 + lVar3;
  *(undefined8 *)((long)pvVar2 + -0xb8) = 0x960a78;
  *(undefined8 *)((long)pvVar2 + 0x88) = 0x960af0;
  *(undefined8 *)((long)pvVar2 + -0x30) = 0x960aa0;
  *(undefined8 *)((long)pvVar2 + -0x20) = 0x960ac8;
  if (*(void **)((long)pvVar2 + -0x10) != pvVar2) {
    operator_delete(*(void **)((long)pvVar2 + -0x10));
  }
  *puVar1 = 0x960b90;
  puVar1[0x28] = 0x960bb8;
  if ((undefined8 *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((undefined8 *)puVar1[0xc]);
  }
  if ((undefined8 *)puVar1[7] != puVar1 + 9) {
    operator_delete((undefined8 *)puVar1[7]);
  }
  if ((undefined8 *)puVar1[2] != puVar1 + 4) {
    operator_delete((undefined8 *)puVar1[2]);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

IfcStructuralPointConnection() : Object("IfcStructuralPointConnection") {}